

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O1

void __thiscall
ApiLayerInterface::ApiLayerInterface
          (ApiLayerInterface *this,string *layer_name,LoaderPlatformLibraryHandle layer_library,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *supported_extensions,PFN_xrGetInstanceProcAddr get_instance_proc_addr,
          PFN_xrCreateApiLayerInstance create_api_layer_instance)

{
  pointer pcVar1;
  
  this->_vptr_ApiLayerInterface = (_func_int **)&PTR__ApiLayerInterface_00150990;
  (this->_layer_name)._M_dataplus._M_p = (pointer)&(this->_layer_name).field_2;
  pcVar1 = (layer_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_layer_name,pcVar1,pcVar1 + layer_name->_M_string_length);
  this->_layer_library = layer_library;
  this->_get_instance_proc_addr = get_instance_proc_addr;
  this->_create_api_layer_instance = create_api_layer_instance;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_supported_extensions,supported_extensions);
  return;
}

Assistant:

ApiLayerInterface::ApiLayerInterface(const std::string& layer_name, LoaderPlatformLibraryHandle layer_library,
                                     std::vector<std::string>& supported_extensions,
                                     PFN_xrGetInstanceProcAddr get_instance_proc_addr,
                                     PFN_xrCreateApiLayerInstance create_api_layer_instance)
    : _layer_name(layer_name),
      _layer_library(layer_library),
      _get_instance_proc_addr(get_instance_proc_addr),
      _create_api_layer_instance(create_api_layer_instance),
      _supported_extensions(supported_extensions) {}